

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O3

ion_status_t oah_insert(ion_hashmap_t *hash_map,ion_key_t key,ion_value_t value)

{
  int iVar1;
  char cVar2;
  int iVar3;
  ion_status_t iVar4;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  ion_status_t iVar5;
  ion_status_t iVar6;
  ion_status_t iVar7;
  
  iVar3 = (*hash_map->compute_hash)(hash_map,key,(hash_map->super).record.key_size);
  iVar8 = hash_map->map_size;
  if (iVar8 != 0) {
    uVar10 = (long)iVar3 % (long)iVar8 & 0xffffffff;
    iVar3 = 0;
    do {
      iVar1 = (hash_map->super).record.key_size;
      iVar11 = ((hash_map->super).record.value_size + iVar1 + 1) * (int)uVar10;
      pcVar12 = hash_map->entry + iVar11;
      uVar9 = (uint)(byte)hash_map->entry[iVar11];
      if (uVar9 == 0xfd) {
        cVar2 = (*(hash_map->super).compare)(pcVar12 + 1,key,iVar1);
        if (cVar2 == '\0') {
          if (hash_map->write_concern == '\x01') {
            iVar5.error = '\x02';
            iVar5._1_3_ = 0;
            iVar5.count = 0;
            return iVar5;
          }
          if (hash_map->write_concern != '\0') {
            iVar6.error = '\a';
            iVar6._1_3_ = 0;
            iVar6.count = 0;
            return iVar6;
          }
          pcVar12 = pcVar12 + 1 + (hash_map->super).record.key_size;
          iVar8 = (hash_map->super).record.value_size;
          goto LAB_00108267;
        }
        iVar8 = hash_map->map_size;
      }
      else if (uVar9 - 0xfe < 2) {
        *pcVar12 = -3;
        memcpy(pcVar12 + 1,key,(long)(hash_map->super).record.key_size);
        pcVar12 = pcVar12 + (long)(hash_map->super).record.key_size + 1;
        iVar8 = (hash_map->super).record.value_size;
LAB_00108267:
        memcpy(pcVar12,value,(long)iVar8);
        iVar7.error = '\0';
        iVar7._1_3_ = 0;
        iVar7.count = 1;
        return iVar7;
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
      if (iVar8 <= (int)uVar9) {
        uVar10 = 0;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != iVar8);
  }
  iVar4.error = '\x03';
  iVar4._1_3_ = 0;
  iVar4.count = 0;
  return iVar4;
}

Assistant:

ion_status_t
oah_insert(
	ion_hashmap_t	*hash_map,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_hash_t hash = hash_map->compute_hash(hash_map, key, hash_map->super.record.key_size);	/* compute hash value for given key */

	int loc			= oah_get_location(hash, hash_map->map_size);

	/* Scan until find an empty location - oah_insert if found */
	int count		= 0;

	ion_hash_bucket_t *item;

	while (count != hash_map->map_size) {
		item = ((ion_hash_bucket_t *) ((hash_map->entry + (hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS)) * loc)));

		if (item->status == ION_IN_USE) {
			/* if a cell is in use, need to key to */

			if (hash_map->super.compare(item->data, key, hash_map->super.record.key_size) == ION_IS_EQUAL) {
				if (hash_map->write_concern == wc_insert_unique) {
					/* allow unique entries only */
					return ION_STATUS_ERROR(err_duplicate_key);
				}
				else if (hash_map->write_concern == wc_update) {
					/* allows for values to be updated */
					memcpy(item->data + hash_map->super.record.key_size, value, (hash_map->super.record.value_size));
					return ION_STATUS_OK(1);
				}
				else {
					return ION_STATUS_ERROR(err_file_write_error);	/* there is a configuration issue with write concern */
				}
			}
		}
		else if ((item->status == ION_EMPTY) || (item->status == ION_DELETED)) {
			/* problem is here with base types as it is just an array of data.  Need better way */
			item->status = ION_IN_USE;
			memcpy(item->data, key, (hash_map->super.record.key_size));
			memcpy(item->data + hash_map->super.record.key_size, value, (hash_map->super.record.value_size));
			return ION_STATUS_OK(1);
		}

		loc++;

		if (loc >= hash_map->map_size) {
			/* Perform wrapping */
			loc = 0;
		}

#if ION_DEBUG
		printf("checking location %i\n", loc);
#endif
		count++;
	}

#if ION_DEBUG
	printf("Hash table full.  Insert not done");
#endif

	return ION_STATUS_ERROR(err_max_capacity);
}